

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void __thiscall JsonArray_MinusZero_Test::TestBody(JsonArray_MinusZero_Test *this)

{
  bool bVar1;
  MockSpec<std::error_code_()> *pMVar2;
  TypedExpectation<std::error_code_()> *pTVar3;
  MockSpec<std::error_code_(long)> *this_00;
  TypedExpectation<std::error_code_(long)> *this_01;
  error_code *this_02;
  Message *message;
  char *message_00;
  extensions extensions;
  mock_json_callbacks *in_RSI;
  mock_json_callbacks *this_03;
  char *in_R9;
  string local_198;
  AssertHelper local_178;
  Message local_170;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_;
  undefined1 local_130 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  MockSpec<std::error_code_()> local_88;
  WithoutMatchers local_71;
  Matcher<long> local_70;
  MockSpec<std::error_code_(long)> local_58;
  WithoutMatchers local_35 [13];
  MockSpec<std::error_code_()> local_28;
  InSequence local_11;
  JsonArray_MinusZero_Test *pJStack_10;
  InSequence _;
  JsonArray_MinusZero_Test *this_local;
  
  pJStack_10 = this;
  testing::InSequence::InSequence(&local_11);
  local_28.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_begin_array
                 ((MockSpec<std::error_code_()> *)&(this->super_JsonArray).callbacks_,in_RSI);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<std::error_code_()>::operator()
                     (&local_28,local_35,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0x7b,"callbacks_","begin_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  testing::Matcher<long>::Matcher(&local_70,0);
  mock_json_callbacks::gmock_int64_value
            (&local_58,&(this->super_JsonArray).callbacks_.super_mock_json_callbacks,&local_70);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_(long)>::operator()
                      (&local_58,&local_71,(void *)0x0);
  this_01 = testing::internal::MockSpec<std::error_code_(long)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                       ,0x7c,"callbacks_","int64_value (0)");
  this_03 = (mock_json_callbacks *)0x1;
  testing::internal::TypedExpectation<std::error_code_(long)>::Times(this_01,1);
  testing::internal::MockSpec<std::error_code_(long)>::~MockSpec(&local_58);
  testing::Matcher<long>::~Matcher(&local_70);
  local_88.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_end_array
                 ((MockSpec<std::error_code_()> *)&(this->super_JsonArray).callbacks_,this_03);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<std::error_code_()>::operator()
                     (&local_88,(WithoutMatchers *)((long)&p.coordinate_.row + 3),(void *)0x0);
  extensions = 0x1effd7;
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0x7d,"callbacks_","end_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  testing::InSequence::~InSequence(&local_11);
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_130,
             (json *)&(this->super_JsonArray).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x0,
             extensions);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar_.message_,"[-0]",4);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_130,
             (string *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  this_02 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::last_error
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_130);
  local_161 = std::error_code::operator_cast_to_bool(this_02);
  local_161 = !local_161;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_160,&local_161,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    message = testing::Message::operator<<
                        (&local_170,(char (*) [36])"Expected the parse error to be zero");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)local_160,(AssertionResult *)"p.last_error ()","true","false",
               in_R9);
    message_00 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x81,message_00);
    testing::internal::AssertHelper::operator=(&local_178,message);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_130);
  return;
}

Assistant:

TEST_F (JsonArray, MinusZero) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_array ()).Times (1);
        EXPECT_CALL (callbacks_, int64_value (0)).Times (1);
        EXPECT_CALL (callbacks_, end_array ()).Times (1);
    }
    auto p = json::make_parser (proxy_);
    p.input ("[-0]"s);
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
}